

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

int Aig_ManSeqCleanupBasic(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  Aig_ManIncrementTravId(p);
  iVar3 = p->nTravIds;
  p->pConst1->TravId = iVar3;
  iVar2 = p->nRegs;
  if (iVar2 < p->nObjs[2]) {
    pVVar4 = p->vCis;
    uVar7 = pVVar4->nSize;
    uVar11 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar11;
    }
    do {
      if (uVar9 == uVar11) goto LAB_006cdeaf;
      *(int *)((long)pVVar4->pArray[uVar11] + 0x20) = iVar3;
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nObjs[2] - (long)iVar2);
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  if (p->nRegs < p->nObjs[3]) {
    lVar12 = 0;
    do {
      if (p->vCos->nSize <= lVar12) goto LAB_006cdeaf;
      pvVar1 = p->vCos->pArray[lVar12];
      uVar7 = pVVar4->nCap;
      if (pVVar4->nSize == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar7 * 2;
          if (iVar3 <= (int)uVar7) goto LAB_006cdd05;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar7 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar3;
      }
LAB_006cdd05:
      iVar3 = pVVar4->nSize;
      pVVar4->nSize = iVar3 + 1;
      pVVar4->pArray[iVar3] = pvVar1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (long)p->nObjs[3] - (long)p->nRegs);
  }
  iVar3 = p->nRegs;
  if (0 < iVar3) {
    iVar2 = 0;
    do {
      uVar7 = (p->nObjs[3] - iVar3) + iVar2;
      if (((((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) ||
          (uVar10 = (p->nObjs[2] - iVar3) + iVar2, (int)uVar10 < 0)) ||
         (p->vCis->nSize <= (int)uVar10)) goto LAB_006cdeaf;
      *(void **)p->vCis->pArray[uVar10] = p->vCos->pArray[uVar7];
      iVar2 = iVar2 + 1;
      iVar3 = p->nRegs;
    } while (iVar2 < iVar3);
  }
  iVar3 = pVVar4->nSize;
  if (0 < iVar3) {
    lVar12 = 0;
    do {
      Aig_ManSeqCleanup_rec(p,(Aig_Obj_t *)pVVar4->pArray[lVar12],pVVar4);
      lVar12 = lVar12 + 1;
      iVar3 = pVVar4->nSize;
    } while (lVar12 < iVar3);
  }
  if (p->nObjs[3] < iVar3) {
    __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                  ,0x119,"int Aig_ManSeqCleanupBasic(Aig_Man_t *)");
  }
  iVar3 = p->nRegs;
  if (0 < iVar3) {
    iVar2 = 0;
    do {
      iVar8 = (p->nObjs[3] - iVar3) + iVar2;
      if (((iVar8 < 0) || (p->vCos->nSize <= iVar8)) ||
         ((uVar7 = (p->nObjs[2] - iVar3) + iVar2, (int)uVar7 < 0 || (p->vCis->nSize <= (int)uVar7)))
         ) {
LAB_006cdeaf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(undefined8 *)p->vCis->pArray[uVar7] = 0;
      iVar2 = iVar2 + 1;
      iVar3 = p->nRegs;
    } while (iVar2 < iVar3);
  }
  if ((pVVar4->nSize < p->nObjs[3]) && (pVVar6 = p->vCos, 0 < pVVar6->nSize)) {
    lVar12 = 0;
    do {
      if (((Aig_Obj_t *)pVVar6->pArray[lVar12])->TravId != p->nTravIds) {
        Aig_ObjPatchFanin0(p,(Aig_Obj_t *)pVVar6->pArray[lVar12],
                           (Aig_Obj_t *)((ulong)p->pConst1 ^ 1));
      }
      lVar12 = lVar12 + 1;
      pVVar6 = p->vCos;
    } while (lVar12 < pVVar6->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  free(pVVar4);
  iVar3 = Aig_ManCleanup(p);
  return iVar3;
}

Assistant:

int Aig_ManSeqCleanupBasic( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        // add constant drivers to the dangling latches
        Aig_ManForEachCo( p, pObj, i )
            if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
                Aig_ObjPatchFanin0( p, pObj, Aig_ManConst0(p) );
    }
    Vec_PtrFree( vNodes );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}